

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O2

void __thiscall QFont::QFont(QFont *this,QString *family,int pointSize,int weight,bool italic)

{
  Data *pDVar1;
  qsizetype qVar2;
  uint uVar3;
  int iVar4;
  QFontPrivate *pQVar5;
  long lVar6;
  storage_type_conflict *psVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  qreal qVar12;
  QArrayDataPointer<QString> local_98;
  QArrayDataPointer<char16_t> local_80;
  QStringView local_68;
  QArrayDataPointer<QStringView> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QFontPrivate *)operator_new(0x98);
  QFontPrivate::QFontPrivate(pQVar5);
  (this->d).d.ptr = pQVar5;
  LOCK();
  (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  this->resolve_mask = 0x20000;
  if (pointSize < 1) {
    qVar12 = 12.0;
    uVar3 = 0x20000;
  }
  else {
    this->resolve_mask = 0x20002;
    qVar12 = (qreal)pointSize;
    uVar3 = 0x20002;
  }
  if (weight < 0) {
    uVar10 = 0x1900000000000;
  }
  else {
    uVar3 = uVar3 | 0x30;
    this->resolve_mask = uVar3;
    uVar10 = (ulong)(weight & 0x3ff) << 0x28;
  }
  if (italic) {
    this->resolve_mask = uVar3 | 0x20;
    uVar8 = 0x10000000;
  }
  else {
    uVar8 = 0;
  }
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QString *)0x0;
  pDVar1 = (Data *)(family->d).size;
  if (pDVar1 != (Data *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QStringView *)&DAT_aaaaaaaaaaaaaaaa;
    local_80.ptr = (family->d).ptr;
    uVar11 = 0;
    local_80.d = pDVar1;
    QStringView::split(&local_58,&local_80,0x2c,0,1);
    qVar2 = local_58.size;
    iVar4 = (int)local_58.size;
    QList<QString>::reserve((QList<QString> *)&local_98,(long)iVar4);
    uVar9 = qVar2 & 0xffffffff;
    if (iVar4 < 1) {
      uVar9 = uVar11;
    }
    for (; uVar9 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
      local_68.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_68 = QStringView::trimmed((QStringView *)((long)&(local_58.ptr)->m_size + uVar11));
      psVar7 = local_68.m_data;
      lVar6 = local_68.m_size;
      if (lVar6 != 0) {
        if (*psVar7 == L'\'') {
          if (psVar7[lVar6 + -1] == L'\'') goto LAB_00416c6c;
        }
        else if ((*psVar7 == L'\"') && (psVar7[lVar6 + -1] == L'\"')) {
LAB_00416c6c:
          local_68 = QStringView::mid(&local_68,1,lVar6 + -2);
        }
      }
      QStringView::toString((QString *)&local_80,&local_68);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_98,(QString *)&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    }
    QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_58);
  }
  QArrayDataPointer<QString>::operator=
            ((QArrayDataPointer<QString> *)&((this->d).d.ptr)->request,&local_98);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_98);
  pQVar5 = (this->d).d.ptr;
  (pQVar5->request).pointSize = qVar12;
  (pQVar5->request).pixelSize = -1.0;
  *(ulong *)&(pQVar5->request).field_0x60 =
       *(ulong *)&(pQVar5->request).field_0x60 & 0xfffc00ffffffffff | uVar10;
  pQVar5 = (this->d).d.ptr;
  *(ulong *)&(pQVar5->request).field_0x60 =
       *(ulong *)&(pQVar5->request).field_0x60 & 0xffffffffcfffffff | uVar8;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QFont::QFont(const QString &family, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0) {
        pointSize = 12;
    } else {
        resolve_mask |= QFont::SizeResolved;
    }

    if (weight < 0) {
        weight = Normal;
    } else {
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;
    }

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = splitIntoFamilies(family);
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}